

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_translation_unit_tree(FILE *out,AST_Translation_Unit *unit)

{
  AST *tree;
  
  while (unit = (AST_Translation_Unit *)(unit->components).first,
        unit != (AST_Translation_Unit *)0x0) {
    tree = *(AST **)unit;
    print_ast(out,tree);
    if (tree->type != ST_FUNCTION_DEFINITION) {
      fwrite(";\n",2,1,(FILE *)out);
    }
  }
  return;
}

Assistant:

void print_translation_unit_tree(FILE *out,struct AST_Translation_Unit *unit)
{
	struct Queue_Node *it;	
	struct AST* hold;
	for(it=unit->components.first;it!=NULL;it=it->prev)
	{
		hold=(struct AST*)(it->data);
		print_ast(out,hold);
		if(hold->type!=ST_FUNCTION_DEFINITION)
		{
			fprintf(out,";\n");
		}
	}
}